

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.tab.cpp
# Opt level: O0

void yy_stack_print(yy_state_t *yybottom,yy_state_t *yytop)

{
  int yybot;
  yy_state_t *yytop_local;
  yy_state_t *yybottom_local;
  
  fprintf(_stderr,"Stack now");
  for (yytop_local = yybottom; yytop_local <= yytop; yytop_local = yytop_local + 1) {
    fprintf(_stderr," %d",(ulong)*yytop_local);
  }
  fprintf(_stderr,"\n");
  return;
}

Assistant:

static void
yy_stack_print (yy_state_t *yybottom, yy_state_t *yytop)
{
  YYFPRINTF (stderr, "Stack now");
  for (; yybottom <= yytop; yybottom++)
    {
      int yybot = *yybottom;
      YYFPRINTF (stderr, " %d", yybot);
    }
  YYFPRINTF (stderr, "\n");
}